

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::conflictAnalyzeReconvergence
          (HighsDomain *this,HighsDomainChange *domchg,HighsInt *proofinds,double *proofvals,
          HighsInt prooflen,double proofrhs,HighsConflictPool *conflictPool)

{
  HighsDomain *this_00;
  pointer ppVar1;
  double dVar2;
  int iVar3;
  HighsMipSolverData *pHVar4;
  pointer piVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint depthLevel;
  LocalDomChg *__v;
  HighsInt ninfmin;
  HighsCDouble activitymin;
  _Alloc_node __an;
  ConflictSet conflictSet;
  int local_114;
  HighsCDouble local_110;
  LocalDomChg local_100;
  undefined1 local_e8 [64];
  _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
  local_a8;
  pointer local_78;
  LocalDomChg *local_60;
  LocalDomChg *local_58;
  pointer local_48;
  
  pHVar4 = (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
  this_00 = &pHVar4->domain;
  if (((this_00 != this) && ((pHVar4->domain).infeasible_ == false)) &&
     (propagate(this_00),
     (((this->mipsolver->mipdata_)._M_t.
       super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
       super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
       super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain).infeasible_ ==
     false)) {
    ConflictSet::ConflictSet((ConflictSet *)local_e8,this);
    computeMinActivity(&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->domain,0
                       ,prooflen,proofinds,proofvals,&local_114,&local_110);
    if (local_114 == 0) {
      local_100.pos =
           (int)((ulong)((long)(this->domchgstack_).
                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->domchgstack_).
                              super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_100.domchg.boundval = domchg->boundval;
      local_100.domchg.column = domchg->column;
      local_100.domchg.boundtype = domchg->boundtype;
      bVar6 = ConflictSet::explainBoundChangeLeq
                        ((ConflictSet *)local_e8,
                         (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          *)&local_a8,&local_100,proofinds,proofvals,prooflen,proofrhs,
                         local_110.hi + local_110.lo);
      if ((bVar6) &&
         (pHVar4 = (this->mipsolver->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,
         uVar8 = ((long)local_58 - (long)local_60 >> 3) * -0x5555555555555552,
         uVar7 = ((long)*(pointer *)
                         ((long)&(pHVar4->integral_cols).
                                 super__Vector_base<int,_std::allocator<int>_> + 8) -
                  *(long *)&(pHVar4->integral_cols).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl >> 2) * 3 + 1000, uVar8 < uVar7 || uVar8 - uVar7 == 0)) {
        local_100._0_8_ = &local_a8;
        if (local_60 != local_58) {
          __v = local_60;
          do {
            std::
            _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
            ::
            _M_insert_unique_<HighsDomain::ConflictSet::LocalDomChg&,std::_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>::_Alloc_node>
                      ((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,HighsDomain::ConflictSet::LocalDomChg,std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,std::less<HighsDomain::ConflictSet::LocalDomChg>,std::allocator<HighsDomain::ConflictSet::LocalDomChg>>
                        *)&local_a8,(const_iterator)&local_a8._M_impl.super__Rb_tree_header,__v,
                       (_Alloc_node *)&local_100);
            __v = __v + 1;
          } while (__v != local_58);
        }
        piVar5 = (this->branchPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = (ulong)((long)(this->branchPos_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)piVar5) >> 2;
        uVar9 = (uint)uVar7;
        uVar7 = uVar7 & 0xffffffff;
        uVar10 = uVar9 + 1;
        while (depthLevel = (int)uVar9 >> 0x1f & uVar9, 0 < (int)uVar7) {
          iVar3 = piVar5[uVar7 - 1];
          uVar7 = uVar7 - 1;
          dVar2 = (this->domchgstack_).
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar3].boundval;
          uVar10 = uVar10 - 1;
          ppVar1 = (this->prevboundval_).
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + iVar3;
          depthLevel = uVar10;
          if ((dVar2 != ppVar1->first) || (NAN(dVar2) || NAN(ppVar1->first))) break;
        }
        ConflictSet::resolveDepth
                  ((ConflictSet *)local_e8,
                   (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    *)&local_a8,depthLevel,0,0,false);
        HighsConflictPool::addReconvergenceCut
                  (conflictPool,this,
                   (set<HighsDomain::ConflictSet::LocalDomChg,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                    *)&local_a8,domchg);
      }
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48);
    }
    if (local_60 != (LocalDomChg *)0x0) {
      operator_delete(local_60);
    }
    if (local_78 != (pointer)0x0) {
      operator_delete(local_78);
    }
    std::
    _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::~_Rb_tree(&local_a8);
    std::
    _Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::~_Rb_tree((_Rb_tree<HighsDomain::ConflictSet::LocalDomChg,_HighsDomain::ConflictSet::LocalDomChg,_std::_Identity<HighsDomain::ConflictSet::LocalDomChg>,_std::less<HighsDomain::ConflictSet::LocalDomChg>,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                 *)(local_e8 + 0x10));
  }
  return;
}

Assistant:

void HighsDomain::conflictAnalyzeReconvergence(
    const HighsDomainChange& domchg, const HighsInt* proofinds,
    const double* proofvals, HighsInt prooflen, double proofrhs,
    HighsConflictPool& conflictPool) {
  if (&mipsolver->mipdata_->domain == this) return;

  if (mipsolver->mipdata_->domain.infeasible()) return;

  mipsolver->mipdata_->domain.propagate();
  if (mipsolver->mipdata_->domain.infeasible()) return;

  ConflictSet conflictSet(*this);

  HighsInt ninfmin;
  HighsCDouble activitymin;
  mipsolver->mipdata_->domain.computeMinActivity(
      0, prooflen, proofinds, proofvals, ninfmin, activitymin);
  if (ninfmin != 0) return;

  if (!conflictSet.explainBoundChangeLeq(
          conflictSet.reconvergenceFrontier,
          ConflictSet::LocalDomChg{HighsInt(domchgstack_.size()), domchg},
          proofinds, proofvals, prooflen, proofrhs, double(activitymin)))
    return;

  if (10 * conflictSet.resolvedDomainChanges.size() >
      1000 + 3 * mipsolver->mipdata_->integral_cols.size())
    return;

  conflictSet.reconvergenceFrontier.insert(
      conflictSet.resolvedDomainChanges.begin(),
      conflictSet.resolvedDomainChanges.end());

  HighsInt depth = branchPos_.size();

  while (depth > 0) {
    HighsInt branchPos = branchPos_[depth - 1];
    if (domchgstack_[branchPos].boundval != prevboundval_[branchPos].first)
      break;

    --depth;
  }

  conflictSet.resolveDepth(conflictSet.reconvergenceFrontier, depth, 0);
  conflictPool.addReconvergenceCut(*this, conflictSet.reconvergenceFrontier,
                                   domchg);
}